

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_rx_cb(void *arg)

{
  nni_mtx *mtx;
  nni_aio *aio;
  nng_sockaddr *sa;
  udp_sp_creq *cack;
  nng_err nVar1;
  size_t sVar2;
  undefined1 local_40 [8];
  nni_aio_completions complq;
  undefined2 local_30;
  
  aio = (nni_aio *)((long)arg + 0x658);
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  nVar1 = nni_aio_result(aio);
  if (nVar1 == NNG_OK) {
    if (*(char *)((long)arg + 0x37) == '\x01') {
switchD_001265c1_caseD_1:
      *(undefined1 *)((long)arg + 0x37) = 0;
    }
    else {
      cack = *(udp_sp_creq **)((long)arg + 0xa28);
      sVar2 = nng_aio_count(aio);
      if ((0x13 < sVar2) && (cack->us_ver == '\x01')) {
        sa = (nng_sockaddr *)((long)arg + 0x408);
        switch(cack->us_op_code) {
        case '\0':
          udp_recv_data((udp_ep *)arg,(udp_sp_data *)cack,sVar2 - 0x14,sa);
          break;
        case '\x01':
          udp_recv_creq((udp_ep *)arg,cack,sa);
          break;
        case '\x02':
          udp_recv_cack((udp_ep *)arg,cack,sa);
          break;
        case '\x03':
          udp_recv_disc((udp_ep *)arg,(udp_sp_disc *)(ulong)cack->us_sender_id,
                        (nng_sockaddr *)(ulong)cack->us_peer_id);
          break;
        default:
          complq._0_4_ = cack->us_sender_id;
          local_40._2_2_ = *(undefined2 *)((long)arg + 0x30);
          local_40._0_2_ = 0x301;
          local_40._4_4_ = 0;
          complq._4_4_ = 0;
          local_30 = 7;
          udp_queue_tx((udp_ep *)arg,sa,(udp_sp_msg *)local_40,(nni_msg *)0x0);
        }
      }
    }
    udp_start_rx((udp_ep *)arg);
    local_40 = *(undefined1 (*) [8])((long)arg + 0xa50);
    nni_aio_completions_init((nni_aio_completions *)((long)arg + 0xa50));
    nni_mtx_unlock(mtx);
    nni_aio_completions_run((nni_aio_completions *)local_40);
    return;
  }
  nVar1 = nni_aio_result(aio);
  switch(nVar1) {
  case NNG_EINTR:
  case NNG_ETIMEDOUT:
  case NNG_EAGAIN:
    goto switchD_001265c1_caseD_1;
  default:
    if ((nVar1 == NNG_ESTOPPED) || (nVar1 == NNG_ECANCELED)) goto switchD_001265c1_caseD_7;
  case NNG_ENOMEM:
  case NNG_EINVAL:
  case NNG_EBUSY:
  case NNG_ECONNREFUSED:
    *(undefined1 *)((long)arg + 0x37) = 1;
    nni_sleep_aio(5,aio);
  case NNG_ECLOSED:
switchD_001265c1_caseD_7:
    nni_mtx_unlock(mtx);
    return;
  }
}

Assistant:

static void
udp_rx_cb(void *arg)
{
	udp_ep             *ep  = arg;
	nni_aio            *aio = &ep->rx_aio;
	int                 rv;
	size_t              n;
	udp_sp_msg         *hdr;
	nng_sockaddr       *sa;
	nni_aio_completions complq;

	// for a received packet we are either receiving it for a
	// connection we already have established, or for a new connection.
	// Dialers cannot receive connection requests (as a safety
	// precaution).

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		// something bad happened on RX... which is unexpected.
		// sleep a little bit and hope for recovery.
		switch (nni_aio_result(aio)) {
		case NNG_ECLOSED:
		case NNG_ECANCELED:
		case NNG_ESTOPPED:
			nni_mtx_unlock(&ep->mtx);
			return;
		case NNG_ETIMEDOUT:
		case NNG_EAGAIN:
		case NNG_EINTR:
			ep->cooldown = false;
			goto finish;
			break;
		default:
			ep->cooldown = true;
			nni_sleep_aio(5, aio);
			nni_mtx_unlock(&ep->mtx);
			return;
		}
	}
	if (ep->cooldown) {
		ep->cooldown = false;
		goto finish;
	}

	// Received message will be in the ep rx header.
	hdr = ep->rx_msg;
	sa  = &ep->rx_sa;
	n   = nng_aio_count(aio);

	if ((n >= sizeof(*hdr)) && (hdr->data.us_ver == 1)) {
		n -= sizeof(*hdr);

#ifndef NNG_LITTLE_ENDIAN
		// Fix the endianness, so other routines don't have to.
		// It turns out that the endianness of the fields of CREQ
		// is compatible with the fields of every other message type.
		// We only have to do this for systems that are not known
		// (at compile time) to be little endian.
		hdr->data.us_type      = NNI_GET16LE(&hdr->data.us_type);
		hdr->data.us_sender_id = NNI_GET32LE(&hdr->data.us_sender_id);
		hdr->data.us_peeer_id  = NNI_GET32LE(&hdr->data.us_peer_id);
		hdr->data.us_sequence  = NNI_GET32LE(&hdr->data.us_sequence);
		hdr->data.us_length    = NNI_GET16LE(&hdr->data.us_length);
#endif

		switch (hdr->data.us_op_code) {
		case OPCODE_DATA:
			udp_recv_data(ep, &hdr->data, n, sa);
			break;
		case OPCODE_CREQ:
			udp_recv_creq(ep, &hdr->creq, sa);
			break;
		case OPCODE_CACK:
			udp_recv_cack(ep, &hdr->cack, sa);
			break;
		case OPCODE_DISC:
			udp_recv_disc(ep, &hdr->disc, sa);
			break;
		case OPCODE_MESH: // TODO:
		                  // udp_recv_mesh(ep, &hdr->mesh, sa);
		                  // break;
		default:
			udp_send_disc_full(
			    ep, sa, 0, hdr->data.us_sender_id, 0, DISC_PROTO);
			break;
		}
	}

finish:
	// start another receive
	udp_start_rx(ep);

	// grab the list of completions so we can finish them.
	complq = ep->complq;
	nni_aio_completions_init(&ep->complq);
	nni_mtx_unlock(&ep->mtx);

	// now run the completions -- synchronously
	nni_aio_completions_run(&complq);
}